

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O1

void __thiscall
Hpipe::CharItem::get_possible_paths
          (CharItem *this,Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *paths,
          function<bool_(Hpipe::CharItem_*)> *f)

{
  pointer ppCVar1;
  CharItem *pCVar2;
  pointer pCVar3;
  pointer pVVar4;
  bool bVar5;
  long lVar6;
  pointer __args;
  uint uVar7;
  vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>> *this_00;
  ulong uVar8;
  Vec<Hpipe::CharItem_*> path;
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_> front;
  Vec<Hpipe::CharItem_*> new_path;
  vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> local_80;
  vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_> local_68;
  CharItem *local_50;
  iterator local_48;
  CharItem **local_40;
  _Any_data *local_38;
  
  local_68.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vec<Hpipe::CharItem_*>::Vec((Vec<Hpipe::CharItem_*> *)&local_80,this);
  std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
  emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>
            ((vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>> *)
             &local_68,(Vec<Hpipe::CharItem_*> *)&local_80);
  local_38 = (_Any_data *)f;
  if (local_80.super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.
      super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::vector
                (&local_80,
                 &local_68.
                  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>);
      ppCVar1 = local_68.
                super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar4 = local_68.
               super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (ppCVar1 != (pointer)0x0) {
        pVVar4 = local_68.
                 super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_68.
        super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(ppCVar1,(long)(pVVar4->
                                      super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>
                                      ).
                                      super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppCVar1);
        pVVar4 = local_68.
                 super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_68.
      super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pVVar4;
      pCVar2 = local_80.super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1];
      if ((pCVar2->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
          super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (pCVar2->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
          super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_00143310:
        std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
        emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>
                  ((vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                    *)paths,(Vec<Hpipe::CharItem_*> *)&local_80);
      }
      else {
        local_50 = pCVar2;
        if (*(long *)(local_38 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        bVar5 = (**(code **)(local_38->_M_pod_data + 0x18))(local_38,&local_50);
        if (!bVar5) goto LAB_00143310;
        pCVar3 = (pCVar2->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                 super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__args = (pCVar2->edges).
                      super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                      super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                      super__Vector_impl_data._M_start; __args != pCVar3; __args = __args + 1) {
          std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::vector
                    ((vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)&local_50,
                     &local_80);
          if (local_48._M_current == local_40) {
            std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::
            _M_realloc_insert<Hpipe::CharItem*const&>
                      ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)&local_50,
                       local_48,&__args->item);
          }
          else {
            *local_48._M_current = __args->item;
            local_48._M_current = local_48._M_current + 1;
          }
          lVar6 = (long)local_80.
                        super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          bVar5 = lVar6 != 0;
          if (lVar6 == 0) {
LAB_001432dd:
            this_00 = (vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                       *)&local_68;
            if (bVar5) {
              this_00 = (vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                         *)paths;
            }
          }
          else {
            this_00 = (vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                       *)paths;
            if (*local_80.super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != __args->item) {
              uVar7 = 1;
              do {
                uVar8 = (ulong)uVar7;
                bVar5 = uVar8 < (ulong)(lVar6 >> 3);
                if ((ulong)(lVar6 >> 3) <= uVar8) break;
                uVar7 = uVar7 + 1;
              } while (local_80.
                       super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar8] != __args->item);
              goto LAB_001432dd;
            }
          }
          std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
          emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>
                    (this_00,(Vec<Hpipe::CharItem_*> *)&local_50);
          if (local_50 != (CharItem *)0x0) {
            operator_delete(local_50,(long)local_40 - (long)local_50);
          }
        }
      }
      if (local_80.super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (local_68.
             super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_68.
             super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>::
  ~vector(&local_68);
  return;
}

Assistant:

void CharItem::get_possible_paths( Vec<Vec<CharItem *>> &paths, std::function<bool (CharItem *)> f ) {
    Vec<Vec<CharItem *>> front;
    front << this;
    while ( front.size() ) {
        Vec<CharItem *> path = front.back();
        front.pop_back();

        CharItem *last = path.back();
        if ( last->edges.size() ){
            if ( f( last ) ){
                for( CharEdge &t : last->edges ) {
                    Vec<CharItem *> new_path = path;
                    new_path << t.item;
                    if ( path.contains( t.item ) )
                        paths << new_path;
                    else
                        front << new_path;
                }
            } else
                paths << path;
        } else
            paths << path;
    }
}